

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O1

kvs_ops_stat * filemgr_get_ops_stats(filemgr *file,kvs_info *kvs)

{
  pthread_spinlock_t *__lock;
  kvs_header *pkVar1;
  kvs_ops_stat *pkVar2;
  kvs_node query;
  avl_node local_30;
  
  if ((kvs == (kvs_info *)0x0) || (kvs->id == 0)) {
    pkVar2 = &(file->header).op_stat;
  }
  else {
    pkVar1 = file->kv_header;
    __lock = &pkVar1->lock;
    pthread_spin_lock(__lock);
    pkVar2 = (kvs_ops_stat *)avl_search(pkVar1->idx_id,&local_30,_kvs_stat_cmp);
    if (pkVar2 != (kvs_ops_stat *)0x0) {
      pkVar2 = (kvs_ops_stat *)&pkVar2[-3].num_gets;
    }
    pthread_spin_unlock(__lock);
  }
  return pkVar2;
}

Assistant:

struct kvs_ops_stat *filemgr_get_ops_stats(struct filemgr *file,
                                           struct kvs_info *kvs)
{
    struct kvs_ops_stat *stat = NULL;
    if (!kvs || (kvs && kvs->id == 0)) {
        return &file->header.op_stat;
    } else {
        struct kvs_header *kv_header = file->kv_header;
        struct avl_node *a;
        struct kvs_node query, *node;
        spin_lock(&kv_header->lock);
        query.id = kvs->id;
        a = avl_search(kv_header->idx_id, &query.avl_id, _kvs_stat_cmp);
        if (a) {
            node = _get_entry(a, struct kvs_node, avl_id);
            stat = &node->op_stat;
        }
        spin_unlock(&kv_header->lock);
    }
    return stat;
}